

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O1

void __thiscall SQInstance::Release(SQInstance *this)

{
  SQUnsignedInteger *pSVar1;
  SQUnsignedInteger size;
  
  pSVar1 = &(this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (this->_hook != (SQRELEASEHOOK)0x0) {
    (*this->_hook)(this->_userpointer,0);
  }
  pSVar1 = &(this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 - 1;
  if (*pSVar1 != 0) {
    return;
  }
  size = this->_memsize;
  (**(this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted)(this);
  sq_vm_free(this,size);
  return;
}

Assistant:

void Release() {
        _uiRef++;
        if (_hook) { _hook(_userpointer,0);}
        _uiRef--;
        if(_uiRef > 0) return;
        SQInteger size = _memsize;
        this->~SQInstance();
        SQ_FREE(this, size);
    }